

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::readOp<(moira::Core)0,(moira::Mode)2,4,100ull>(Moira *this,int n,u32 *ea,u32 *result)

{
  u32 uVar1;
  
  uVar1 = computeEA<(moira::Core)0,(moira::Mode)2,4,100ull>(this,n);
  *ea = uVar1;
  uVar1 = read<(moira::Core)0,(moira::AddrSpace)1,4,100ull>(this,uVar1);
  *result = uVar1;
  return;
}

Assistant:

void
Moira::readOp(int n, u32 *ea, u32 *result)
{
    switch (M) {

        case Mode::DN: *result = readD<S>(n);   break;
        case Mode::AN: *result = readA<S>(n);   break;
        case Mode::IM: *result = readI<C, S>(); break;

        default:

            // Compute effective address
            *ea = computeEA<C, M, S, F>(n);

            // Emulate -(An) register modification
            updateAnPD<M, S>(n);

            // Read from effective address
            *result = readM<C, M, S, F>(*ea);

            // Emulate (An)+ register modification
            updateAnPI<M, S>(n);
    }
}